

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

FILE * __thiscall fmt::v5::file::fdopen(file *this,int __fd,char *__modes)

{
  FILE *pFVar1;
  system_error *this_00;
  int *piVar2;
  undefined4 in_register_00000034;
  string_view message;
  
  pFVar1 = test::fdopen(*(int *)CONCAT44(in_register_00000034,__fd),__modes);
  if (pFVar1 != (FILE *)0x0) {
    *(FILE **)this = pFVar1;
    *(int *)CONCAT44(in_register_00000034,__fd) = -1;
    return (FILE *)this;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x2c;
  message.data_ = "cannot associate stream with file descriptor";
  system_error::system_error<>(this_00,*piVar2,message);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

buffered_file file::fdopen(const char *mode) {
  // Don't retry as fdopen doesn't return EINTR.
  FILE *f = FMT_POSIX_CALL(fdopen(fd_, mode));
  if (!f)
    FMT_THROW(system_error(errno,
                           "cannot associate stream with file descriptor"));
  buffered_file bf(f);
  fd_ = -1;
  return bf;
}